

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_exception
          (ConsoleReporter *this,TestCaseException *e)

{
  char *pcVar1;
  ostream *poVar2;
  ConsoleReporter *in_RSI;
  ostream *in_RDI;
  ConsoleReporter *unaff_retaddr;
  int i;
  String *stringified_contexts;
  int num_stringified_contexts;
  undefined4 in_stack_ffffffffffffffc8;
  Enum in_stack_ffffffffffffffcc;
  int local_24;
  char *in_stack_ffffffffffffffe0;
  Enum in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined1 success;
  int iVar3;
  
  success = (undefined1)((uint)in_stack_ffffffffffffffec >> 0x18);
  if ((*(byte *)(*(long *)(in_RDI + 0x68) + 0x3a) & 1) == 0) {
    logTestStart(unaff_retaddr);
    pcVar1 = String::c_str((String *)0x11f8af);
    (**(code **)(*(long *)in_RDI + 0x70))
              (in_RDI,pcVar1,*(undefined4 *)(*(long *)(in_RDI + 0x68) + 0x18)," ");
    successOrFailColoredStringToStream
              (in_RSI,(bool)success,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    poVar2 = Color::operator<<(in_RDI,in_stack_ffffffffffffffcc);
    pcVar1 = "test case THREW exception: ";
    if (((ulong)(in_RSI->subcasesStack).
                super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                ._M_impl.super__Vector_impl_data._M_start & 1) != 0) {
      pcVar1 = "test case CRASHED: ";
    }
    std::operator<<(poVar2,pcVar1);
    Color::operator<<(in_RDI,in_stack_ffffffffffffffcc);
    poVar2 = doctest::operator<<(in_RDI,(String *)
                                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                ));
    std::operator<<(poVar2,"\n");
    local_24 = IReporter::get_num_stringified_contexts();
    if (local_24 != 0) {
      IReporter::get_stringified_contexts();
      poVar2 = Color::operator<<(in_RDI,in_stack_ffffffffffffffcc);
      std::operator<<(poVar2,"  logged: ");
      iVar3 = local_24;
      for (; 0 < local_24; local_24 = local_24 + -1) {
        pcVar1 = "          ";
        if (local_24 == iVar3) {
          pcVar1 = "";
        }
        std::operator<<(*(ostream **)(in_RDI + 8),pcVar1);
        poVar2 = doctest::operator<<(in_RDI,(String *)
                                            CONCAT44(in_stack_ffffffffffffffcc,
                                                     in_stack_ffffffffffffffc8));
        std::operator<<(poVar2,"\n");
      }
    }
    std::operator<<(*(ostream **)(in_RDI + 8),"\n");
    Color::operator<<(in_RDI,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            if(tc->m_no_output)
                return;

            logTestStart();

            file_line_to_stream(tc->m_file.c_str(), tc->m_line, " ");
            successOrFailColoredStringToStream(false, e.is_crash ? assertType::is_require :
                                                                   assertType::is_check);
            s << Color::Red << (e.is_crash ? "test case CRASHED: " : "test case THREW exception: ")
              << Color::Cyan << e.error_string << "\n";

            int num_stringified_contexts = get_num_stringified_contexts();
            if(num_stringified_contexts) {
                auto stringified_contexts = get_stringified_contexts();
                s << Color::None << "  logged: ";
                for(int i = num_stringified_contexts; i > 0; --i) {
                    s << (i == num_stringified_contexts ? "" : "          ")
                      << stringified_contexts[i - 1] << "\n";
                }
            }
            s << "\n" << Color::None;
        }